

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueSymbol.cpp
# Opt level: O0

void __thiscall
slang::ast::ValueSymbol::addDriverFromSideEffect(ValueSymbol *this,ValueDriver *newDriver)

{
  LookupLocation lookupLocation;
  bool bVar1;
  Scope *this_00;
  EvalContext *this_01;
  Symbol *in_RDI;
  optional<std::pair<unsigned_long,_unsigned_long>_> bounds;
  EvalContext evalCtx;
  Scope *scope;
  Scope *in_stack_fffffffffffffbd0;
  Scope *in_stack_fffffffffffffbe8;
  ASTContext *in_stack_fffffffffffffc00;
  EvalContext *in_stack_fffffffffffffc08;
  bitmask<slang::ast::EvalFlags> in_stack_fffffffffffffc17;
  bitmask<slang::ast::EvalFlags> local_3c1;
  bitmask<slang::ast::ASTFlags> local_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined1 local_3a0 [208];
  Type *in_stack_fffffffffffffd30;
  EvalContext *in_stack_fffffffffffffd38;
  Expression *in_stack_fffffffffffffd40;
  ValueDriver *in_stack_fffffffffffffdc0;
  ValueSymbol *in_stack_fffffffffffffdc8;
  DriverBitRange in_stack_fffffffffffffdd0;
  
  this_00 = Symbol::getParentScope(in_RDI);
  local_3b8 = LookupLocation::max;
  uStack_3b0 = DAT_00de66d0;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_3c0,None);
  lookupLocation._8_8_ = in_RDI;
  lookupLocation.scope = in_stack_fffffffffffffbe8;
  ASTContext::ASTContext
            ((ASTContext *)this_00,in_stack_fffffffffffffbd0,lookupLocation,
             (bitmask<slang::ast::ASTFlags>)local_3a0);
  local_3c1.m_bits = '\0';
  bitmask<slang::ast::EvalFlags>::bitmask(&local_3c1);
  EvalContext::EvalContext
            (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,in_stack_fffffffffffffc17);
  not_null<const_slang::ast::Expression_*>::operator*
            ((not_null<const_slang::ast::Expression_*> *)0x4b06ae);
  this_01 = (EvalContext *)getType((ValueSymbol *)0x4b06bf);
  ValueDriver::getBounds
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<std::pair<unsigned_long,_unsigned_long>_> *)0x4b06ee);
  if (bVar1) {
    std::optional<std::pair<unsigned_long,_unsigned_long>_>::operator*
              ((optional<std::pair<unsigned_long,_unsigned_long>_> *)0x4b0723);
    addDriver(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc0);
  }
  EvalContext::~EvalContext(this_01);
  return;
}

Assistant:

void ValueSymbol::addDriverFromSideEffect(const ValueDriver& newDriver) const {
    auto scope = getParentScope();
    SLANG_ASSERT(scope);

    EvalContext evalCtx(ASTContext(*scope, LookupLocation::max));
    auto bounds = ValueDriver::getBounds(*newDriver.prefixExpression, evalCtx, getType());
    if (!bounds)
        return;

    addDriver(*bounds, newDriver);
}